

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_spinlock_lock_noyield(ma_spinlock *pSpinlock)

{
  ma_spinlock mVar1;
  ma_spinlock *pSpinlock_local;
  undefined4 local_c;
  
  if (pSpinlock == (ma_spinlock *)0x0) {
    local_c = MA_INVALID_ARGS;
  }
  else {
    while( true ) {
      LOCK();
      mVar1 = *pSpinlock;
      *pSpinlock = 1;
      UNLOCK();
      if (mVar1 == 0) break;
      do {
      } while (*pSpinlock == 1);
    }
    local_c = MA_SUCCESS;
  }
  return local_c;
}

Assistant:

MA_API ma_result ma_spinlock_lock_noyield(volatile ma_spinlock* pSpinlock)
{
    return ma_spinlock_lock_ex(pSpinlock, MA_FALSE);
}